

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O1

void __thiscall Logger::addLogQueue(Logger *this,LogLevel level,string *message)

{
  pointer pcVar1;
  size_t sVar2;
  unique_lock<std::mutex> lock;
  string datetime;
  tm tm_snapshot;
  time_t in_time_t;
  unique_lock<std::mutex> local_b8;
  undefined4 local_a8;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  char local_68 [16];
  _Alloc_hider local_58;
  char local_48 [16];
  long local_38;
  
  local_38 = std::chrono::_V2::system_clock::now();
  local_38 = local_38 / 1000000000;
  localtime_r(&local_38,(tm *)local_80);
  local_b8._M_device = (mutex_type *)0x0;
  local_b8._8_8_ = 0;
  local_a8 = 0;
  strftime((char *)&local_b8,0x14,"%Y-%m-%d %H:%M:%S",(tm *)local_80);
  local_a0 = local_90;
  sVar2 = strlen((char *)&local_b8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,&local_b8,(long)&local_b8._M_device + sVar2);
  local_b8._M_device = &this->logQueueMtx;
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::mutex>::lock(&local_b8);
  local_b8._M_owns = true;
  local_80._0_4_ = level;
  local_78._M_p = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_a0,local_a0 + local_98);
  pcVar1 = (message->_M_dataplus)._M_p;
  local_58._M_p = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + message->_M_string_length);
  std::deque<LogMessage,_std::allocator<LogMessage>_>::emplace_back<LogMessage>
            (&(this->logQueue).c,(LogMessage *)local_80);
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  if (local_78._M_p != local_68) {
    operator_delete(local_78._M_p);
  }
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_b8);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  return;
}

Assistant:

inline void addLogQueue(LogLevel level, const std::string& message) // 添加到日志队列中
    {
        std::string datetime = getDateTime();
        std::unique_lock<std::mutex> lock(logQueueMtx);
        logQueue.push({level, datetime, message});
        cv.notify_one(); // 唤醒等待的线程
    }